

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.hh
# Opt level: O2

FaceHandle __thiscall OpenMesh::ArrayKernel::new_face(ArrayKernel *this)

{
  BaseHandle BVar1;
  size_t _n;
  Face local_c;
  
  local_c.halfedge_handle_.super_BaseHandle.idx_ = (HalfedgeHandle)(BaseHandle)0xffffffff;
  std::vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::
  emplace_back<OpenMesh::ArrayItems::Face>
            ((vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_> *)
             (this + 0xf8),&local_c);
  _n = (**(code **)(*(long *)this + 0x28))(this);
  PropertyContainer::resize((PropertyContainer *)(this + 0x68),_n);
  BVar1.idx_ = handle(this,(Face *)(*(long *)(this + 0x100) + -4));
  return (BaseHandle)(BaseHandle)BVar1.idx_;
}

Assistant:

inline FaceHandle new_face()
  {
    faces_.push_back(Face());
    fprops_resize(n_faces());
    return handle(faces_.back());
  }